

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChEnumMapper<myEnum>::AddMapping
          (ChEnumMapper<myEnum> *this,char *autoname,myEnum enumid,char *custom_name)

{
  element_type *this_00;
  undefined1 local_58 [8];
  ChEnumNamePair<myEnum> mpair;
  char *name;
  char *custom_name_local;
  myEnum enumid_local;
  char *autoname_local;
  ChEnumMapper<myEnum> *this_local;
  
  mpair._32_8_ = autoname;
  if (custom_name != (char *)0x0) {
    mpair._32_8_ = custom_name;
  }
  ChEnumNamePair<myEnum>::ChEnumNamePair
            ((ChEnumNamePair<myEnum> *)local_58,(char *)mpair._32_8_,enumid);
  this_00 = std::
            __shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->enummap);
  std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>::
  push_back(this_00,(ChEnumNamePair<myEnum> *)local_58);
  ChEnumNamePair<myEnum>::~ChEnumNamePair((ChEnumNamePair<myEnum> *)local_58);
  return;
}

Assistant:

void AddMapping(const char* autoname, Te enumid, const char* custom_name) {
        const char* name = autoname;
        if (custom_name)
            name = custom_name;
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }